

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speedtesting.cpp
# Opt level: O1

double hashALot<ThreeWiseHash<unsigned_int,unsigned_char>>
                 (int n,int L,uint ttimes,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *recorder,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  iterator __position;
  undefined1 auVar1 [16];
  ulong uVar2;
  pointer puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ZTimer t;
  ThreeWiseHash<unsigned_int,_unsigned_char> hf;
  timeval local_4c8;
  timeval local_4b8;
  ThreeWiseHash<unsigned_int,_unsigned_char> local_4a8;
  
  uVar6 = 0;
  gettimeofday(&local_4c8,(__timezone_ptr_t)0x0);
  local_4b8.tv_sec = (__time_t)(uint)local_4c8.tv_sec;
  local_4b8.tv_usec = local_4c8.tv_usec;
  uVar4 = (uint)local_4c8.tv_sec;
  if (ttimes != 0) {
    uVar2 = (ulong)(uint)n;
    do {
      ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash(&local_4a8,n,L);
      if (n != 0) {
        uVar5 = 0;
        do {
          ThreeWiseHash<unsigned_int,_unsigned_char>::eat
                    (&local_4a8,
                     (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar2 < (ulong)((long)(data->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
        uVar4 = 0;
        uVar5 = uVar2;
        do {
          ThreeWiseHash<unsigned_int,_unsigned_char>::update(&local_4a8,puVar3[uVar4],puVar3[uVar5])
          ;
          uVar5 = (ulong)(n + 1 + uVar4);
          puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar4 = uVar4 + 1;
        } while (uVar5 < (ulong)((long)(data->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
      }
      __position._M_current =
           (recorder->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (recorder->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)recorder,__position,
                   &local_4a8.hashvalue);
      }
      else {
        *__position._M_current = local_4a8.hashvalue;
        (recorder->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (local_4a8.hashers.
          super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4a8.hashers.
                        super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
                (&local_4a8.ngram.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
      uVar6 = uVar6 + 1;
      uVar4 = (uint)local_4b8.tv_sec;
    } while (uVar6 != ttimes);
  }
  local_4b8.tv_sec._0_4_ = uVar4;
  gettimeofday(&local_4b8,(__timezone_ptr_t)0x0);
  auVar1 = SEXT816(local_4b8.tv_usec - local_4c8.tv_usec) * SEXT816(0x20c49ba5e353f7cf);
  return (double)(int)(((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) +
                      ((uint)local_4b8.tv_sec - (uint)local_4c8.tv_sec) * 1000) / 1000.0;
}

Assistant:

double hashALot(int n, int L, uint ttimes, vector<uint32> &recorder,
                vector<unsigned char> &data) {
  ZTimer t;
  for (uint times = 0; times < ttimes; ++times) {
    hashfunction hf(n, L);
    for (uint k = 0; k < static_cast<uint>(n); ++k) {
      hf.eat(data[k]);
    }
    for (uint k = n; k < data.size(); ++k) {
      hf.update(data[k - n], data[k]);
    }
    /* The goal of the recorder is to prevent
    the compiler from deciding that this whole computation
    is not required!
    */
    recorder.push_back(hf.hashvalue);
  }
  return t.split() / 1000.0;
}